

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpeedTest.cpp
# Opt level: O0

double CalcMean(vector<double,_std::allocator<double>_> *v)

{
  size_type sVar1;
  reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  int i;
  double mean;
  undefined4 local_14;
  undefined8 local_10;
  
  auVar4 = ZEXT1664((undefined1  [16])0x0);
  local_10 = 0.0;
  local_14 = 0;
  while( true ) {
    auVar3 = auVar4._0_16_;
    sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
    if ((int)sVar1 <= local_14) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)local_14);
    local_10 = *pvVar2 + local_10;
    auVar4 = ZEXT864((ulong)local_10);
    local_14 = local_14 + 1;
  }
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
  auVar3 = vcvtusi2sd_avx512f(auVar3,sVar1);
  return local_10 / auVar3._0_8_;
}

Assistant:

double CalcMean ( std::vector<double> & v )
{
  double mean = 0;
  
  for(int i = 0; i < (int)v.size(); i++)
  {
    mean += v[i];
  }
  
  mean /= double(v.size());
  
  return mean;
}